

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsPath.cpp
# Opt level: O0

void __thiscall WindowsPath::FromFileURL(WindowsPath *this,FileURL *inFileURL)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  value_type local_120;
  value_type local_100;
  value_type local_e0;
  value_type local_c0;
  string local_a0 [48];
  value_type local_70;
  value_type local_50;
  undefined1 local_30 [8];
  SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  itComponents;
  FileURL *inFileURL_local;
  WindowsPath *this_local;
  
  itComponents.
  super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .mCurrentPosition._M_node = (_List_node_base *)inFileURL;
  FileURL::GetComponentsIterator_abi_cxx11_
            ((SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_30,inFileURL);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->mPathComponents);
  std::__cxx11::string::operator=((string *)this,"");
  bVar2 = ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::MoveNext((ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_30);
  if (bVar2) {
    SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::GetItem(&local_50,
              (SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_30);
    SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::GetItem(&local_70,
              (SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_30);
    std::__cxx11::string::length();
    pcVar3 = (char *)std::__cxx11::string::at((ulong)&local_50);
    cVar1 = *pcVar3;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (cVar1 == '|') {
      SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::GetItem(&local_c0,
                (SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_30);
      SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::GetItem(&local_e0,
                (SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_30);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_a0,(ulong)&local_c0);
      std::__cxx11::string::operator=((string *)this,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    else {
      SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::GetItem(&local_100,
                (SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_30);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->mPathComponents,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
    }
    while (bVar2 = ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::MoveNext((ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_30), bVar2) {
      SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::GetItem(&local_120,
                (SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_30);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->mPathComponents,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
  }
  return;
}

Assistant:

void WindowsPath::FromFileURL(const FileURL& inFileURL)
{
    SingleValueContainerIterator<const StringList> itComponents = inFileURL.GetComponentsIterator();

 	mPathComponents.clear();
	mDriveLetter = "";	   
    
    // move to first component (if empty...just return)
    if(!itComponents.MoveNext())
        return;
    
    // check first component, if it's a drive letter
    if(itComponents.GetItem().at(itComponents.GetItem().length() - 1) == '|')
        mDriveLetter = itComponents.GetItem().substr(0,itComponents.GetItem().length() - 1);
    else
        mPathComponents.push_back(itComponents.GetItem());
    
    while(itComponents.MoveNext())
        mPathComponents.push_back(itComponents.GetItem());
        
}